

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testFromStaticStringView(String *str)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  String substr;
  
  if ((str->view_)._M_str != staticStringView.super_string_view._M_str) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.data() == staticStringView.data()) failed on line "
                            );
    iVar6 = 0x117;
LAB_001b0221:
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6);
    std::operator<<(poVar2,"\n");
    return false;
  }
  if ((str->view_)._M_len != staticStringView.super_string_view._M_len) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str_const.size() == staticStringView.size()) failed on line "
                            );
    iVar6 = 0x118;
    goto LAB_001b0221;
  }
  bVar1 = cm::String::is_stable(str);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(!str_const.is_stable()) failed on line ");
    iVar6 = 0x119;
    goto LAB_001b0221;
  }
  pcVar3 = cm::String::c_str(str);
  sVar4 = strlen(pcVar3);
  __y._M_str = staticStringView.super_string_view._M_str;
  __y._M_len = staticStringView.super_string_view._M_len;
  __x._M_str = pcVar3;
  __x._M_len = sVar4;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str.c_str() == staticStringView) failed on line ");
    iVar6 = 0x11a;
    goto LAB_001b0221;
  }
  bVar1 = cm::String::is_stable(str);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!str.is_stable()) failed on line ");
    iVar6 = 0x11b;
    goto LAB_001b0221;
  }
  cm::String::substr(&substr,str,1,0xffffffffffffffff);
  if (substr.view_._M_str == staticStringView.super_string_view._M_str + 1) {
    if (substr.view_._M_len == 2) {
      bVar1 = cm::String::is_stable(&substr);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!substr_const.is_stable()) failed on line ");
        iVar6 = 0x120;
      }
      else {
        pcVar3 = cm::String::c_str(&substr);
        if (pcVar3 == staticStringView.super_string_view._M_str + 1) {
          bVar1 = cm::String::is_stable(&substr);
          bVar5 = true;
          if (!bVar1) goto LAB_001b03bb;
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(!substr.is_stable()) failed on line ");
          iVar6 = 0x122;
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(substr.c_str() == &staticStringView[1]) failed on line "
                                  );
          iVar6 = 0x121;
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(substr_const.size() == 2) failed on line ");
      iVar6 = 0x11f;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr_const.data() == &staticStringView[1]) failed on line "
                            );
    iVar6 = 0x11e;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar6);
  std::operator<<(poVar2,"\n");
  bVar5 = false;
LAB_001b03bb:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&substr.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar5;
}

Assistant:

static bool testConstructFromN()
{
  std::cout << "testConstructFromN()\n";
  cm::String const str(3, 'a');
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), "aaa", 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}